

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexPattern::operator==(RegexPattern *this,RegexPattern *other)

{
  long lVar1;
  UBool UVar2;
  int64_t __offset_1;
  int64_t __offset;
  RegexPattern *other_local;
  RegexPattern *this_local;
  
  if ((this->fFlags == other->fFlags) && (this->fDeferredStatus == other->fDeferredStatus)) {
    if ((this->fPatternString != (UnicodeString *)0x0) &&
       (other->fPatternString != (UnicodeString *)0x0)) {
      UVar2 = icu_63::UnicodeString::operator==(this->fPatternString,other->fPatternString);
      return UVar2;
    }
    if (this->fPattern == (UText *)0x0) {
      if (other->fPattern == (UText *)0x0) {
        return '\x01';
      }
    }
    else if (other->fPattern != (UText *)0x0) {
      lVar1 = this->fPattern->chunkNativeStart;
      if (((lVar1 < 1) && (-lVar1 < (long)this->fPattern->nativeIndexingLimit)) &&
         ((ushort)this->fPattern->chunkContents[-lVar1] < 0xdc00)) {
        this->fPattern->chunkOffset = (int32_t)-lVar1;
      }
      else {
        utext_setNativeIndex_63(this->fPattern,0);
      }
      lVar1 = other->fPattern->chunkNativeStart;
      if (((lVar1 < 1) && (-lVar1 < (long)other->fPattern->nativeIndexingLimit)) &&
         ((ushort)other->fPattern->chunkContents[-lVar1] < 0xdc00)) {
        other->fPattern->chunkOffset = (int32_t)-lVar1;
      }
      else {
        utext_setNativeIndex_63(other->fPattern,0);
      }
      UVar2 = utext_equals_63(this->fPattern,other->fPattern);
      return UVar2;
    }
  }
  return '\0';
}

Assistant:

UBool   RegexPattern::operator ==(const RegexPattern &other) const {
    if (this->fFlags == other.fFlags && this->fDeferredStatus == other.fDeferredStatus) {
        if (this->fPatternString != NULL && other.fPatternString != NULL) {
            return *(this->fPatternString) == *(other.fPatternString);
        } else if (this->fPattern == NULL) {
            if (other.fPattern == NULL) {
                return TRUE;
            }
        } else if (other.fPattern != NULL) {
            UTEXT_SETNATIVEINDEX(this->fPattern, 0);
            UTEXT_SETNATIVEINDEX(other.fPattern, 0);
            return utext_equals(this->fPattern, other.fPattern);
        }
    }
    return FALSE;
}